

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_option.hpp
# Opt level: O2

void __thiscall
duckdb::CSVOption<duckdb::StrpTimeFormat>::Set
          (CSVOption<duckdb::StrpTimeFormat> *this,StrpTimeFormat *value_p,bool by_user)

{
  if (this->set_by_user == false) {
    StrTimeFormat::operator=(&(this->value).super_StrTimeFormat,&value_p->super_StrTimeFormat);
    this->set_by_user = by_user;
  }
  return;
}

Assistant:

void Set(T value_p, bool by_user = true) {
		D_ASSERT(!(by_user && set_by_user));
		if (!set_by_user) {
			// If it's not set by user we can change the value
			value = value_p;
			set_by_user = by_user;
		}
	}